

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 SyHexStrToInt64(char *zSrc,sxu32 nLen,void *pOutVal,char **zRest)

{
  char cVar1;
  byte bVar2;
  ushort *puVar3;
  uint uVar4;
  sxi32 sVar5;
  ushort **ppuVar6;
  ushort *puVar7;
  ushort *puVar8;
  ushort *puVar9;
  ushort *puVar10;
  ushort *puVar11;
  int iVar12;
  ushort *puVar13;
  long lVar14;
  bool bVar15;
  
  puVar13 = (ushort *)(zSrc + nLen);
  if (nLen != 0) {
    ppuVar6 = __ctype_b_loc();
    do {
      cVar1 = (char)*(ushort *)zSrc;
      if ((*(byte *)((long)*ppuVar6 + (long)cVar1 * 2 + 1) & 0x20) == 0) {
        if ((cVar1 == '+') || (cVar1 == '-')) {
          bVar15 = cVar1 == '-';
          zSrc = (char *)((long)zSrc + 1);
          goto LAB_0011b9ec;
        }
        break;
      }
      zSrc = (char *)((long)zSrc + 1);
    } while (zSrc < puVar13);
  }
  bVar15 = false;
LAB_0011b9ec:
  puVar7 = puVar13 + -1;
  if (((zSrc < puVar7) && ((char)*(ushort *)zSrc == '0')) &&
     (uVar4 = *(byte *)((long)zSrc + 1) | 0x20, puVar7 = (ushort *)(ulong)uVar4, uVar4 == 0x78)) {
    zSrc = (char *)((long)zSrc + 2);
  }
  for (; (zSrc < puVar13 && ((char)*(ushort *)zSrc == '0')); zSrc = (char *)((long)zSrc + 1)) {
  }
  if (zSrc < puVar13) {
    ppuVar6 = __ctype_b_loc();
    puVar3 = *ppuVar6;
    lVar14 = 0;
    puVar11 = (ushort *)0x0;
    puVar10 = (ushort *)zSrc;
    do {
      puVar7 = puVar3;
      if (((*(byte *)((long)puVar3 + (long)*(char *)((long)zSrc + lVar14) * 2 + 1) & 0x10) == 0) ||
         (iVar12 = (int)lVar14, 0xf < iVar12)) break;
      uVar4 = SyHexToint((int)*(char *)((long)zSrc + lVar14));
      puVar7 = (ushort *)(ulong)uVar4;
      puVar11 = (ushort *)((long)(int)uVar4 + (long)puVar11 * 0x10);
      puVar8 = (ushort *)((long)zSrc + lVar14 + 1);
      puVar9 = puVar8;
      if ((puVar13 <= puVar8) ||
         ((puVar7 = (ushort *)((long)puVar10 + 1), puVar9 = puVar7, 0xf < iVar12 + 1 ||
          ((puVar3[(char)*puVar8] & 0x1000) == 0)))) goto LAB_0011bb91;
      uVar4 = SyHexToint((int)(char)*puVar8);
      puVar7 = (ushort *)(ulong)uVar4;
      puVar11 = (ushort *)((long)(int)uVar4 + (long)puVar11 * 0x10);
      puVar9 = (ushort *)((long)zSrc + lVar14 + 2);
      if (puVar13 <= puVar9) {
        puVar9 = puVar10 + 1;
        goto LAB_0011bb91;
      }
      puVar7 = (ushort *)(ulong)(iVar12 + 2U);
      if (0xf < (int)(iVar12 + 2U)) goto LAB_0011bb91;
      puVar7 = (ushort *)(ulong)(puVar3[(char)*puVar9] & 0x1000);
      if ((puVar3[(char)*puVar9] & 0x1000) == 0) goto LAB_0011bb91;
      uVar4 = SyHexToint((int)(char)*puVar9);
      puVar7 = (ushort *)(ulong)uVar4;
      puVar11 = (ushort *)((long)(int)uVar4 + (long)puVar11 * 0x10);
      puVar8 = (ushort *)((long)zSrc + lVar14 + 3);
      puVar9 = puVar8;
      if (((puVar13 <= puVar8) ||
          (puVar7 = (ushort *)((long)puVar10 + 3), puVar9 = puVar7, 0xf < iVar12 + 3)) ||
         ((puVar3[(char)*puVar8] & 0x1000) == 0)) goto LAB_0011bb91;
      sVar5 = SyHexToint((int)(char)*puVar8);
      puVar11 = (ushort *)((long)sVar5 + (long)puVar11 * 0x10);
      puVar10 = puVar10 + 2;
      puVar7 = (ushort *)((long)zSrc + lVar14 + 4);
      lVar14 = lVar14 + 4;
    } while (puVar7 < puVar13);
    puVar9 = (ushort *)((long)zSrc + lVar14);
  }
  else {
    puVar11 = (ushort *)0x0;
    puVar9 = (ushort *)zSrc;
  }
LAB_0011bb91:
  if (puVar9 < puVar13) {
    ppuVar6 = __ctype_b_loc();
    puVar7 = *ppuVar6;
    bVar2 = *(byte *)((long)puVar7 + (long)(char)*puVar9 * 2 + 1);
    while (((bVar2 & 0x20) != 0 && (puVar9 = (ushort *)((long)puVar9 + 1), puVar9 < puVar13))) {
      bVar2 = *(byte *)((long)puVar7 + (long)*(char *)puVar9 * 2 + 1);
    }
  }
  if (pOutVal != (void *)0x0) {
    puVar7 = (ushort *)-(long)puVar11;
    if (puVar11 == (ushort *)0x0) {
      puVar7 = puVar11;
    }
    if (!bVar15) {
      puVar7 = puVar11;
    }
    *(ushort **)pOutVal = puVar7;
  }
  return (sxi32)puVar7;
}

Assistant:

JX9_PRIVATE sxi32 SyHexStrToInt64(const char *zSrc, sxu32 nLen, void * pOutVal, const char **zRest)
{
	const char *zIn, *zEnd;
	int isNeg = FALSE;
	sxi64 nVal = 0;
#if defined(UNTRUST)
	if( SX_EMPTY_STR(zSrc) ){
		if( pOutVal ){
			*(sxi32 *)pOutVal = 0;
		}
		return SXERR_EMPTY;
	}
#endif
	zEnd = &zSrc[nLen];
	while( zSrc < zEnd && SyisSpace(zSrc[0]) ){
		zSrc++;
	}
	if( zSrc < zEnd && ( *zSrc == '-' || *zSrc == '+' ) ){
		isNeg = (zSrc[0] == '-') ? TRUE :FALSE;
		zSrc++;
	}
	if( zSrc < &zEnd[-2] && zSrc[0] == '0' && (zSrc[1] == 'x' || zSrc[1] == 'X') ){
		/* Bypass hex prefix */
		zSrc += sizeof(char) * 2;
	}	
	/* Skip leading zero */
	while(zSrc < zEnd && zSrc[0] == '0' ){
		zSrc++;
	}
	zIn = zSrc;
	for(;;){
		if(zSrc >= zEnd || !SyisHex(zSrc[0]) || (int)(zSrc-zIn) > 15) break; nVal = nVal * 16 + SyHexToint(zSrc[0]);  zSrc++ ;
		if(zSrc >= zEnd || !SyisHex(zSrc[0]) || (int)(zSrc-zIn) > 15) break; nVal = nVal * 16 + SyHexToint(zSrc[0]);  zSrc++ ;
		if(zSrc >= zEnd || !SyisHex(zSrc[0]) || (int)(zSrc-zIn) > 15) break; nVal = nVal * 16 + SyHexToint(zSrc[0]);  zSrc++ ;
		if(zSrc >= zEnd || !SyisHex(zSrc[0]) || (int)(zSrc-zIn) > 15) break; nVal = nVal * 16 + SyHexToint(zSrc[0]);  zSrc++ ;
	}
	while( zSrc < zEnd && SyisSpace(zSrc[0]) ){
		zSrc++;
	}	
	if( zRest ){
		*zRest = zSrc;
	}
	if( pOutVal ){
		if( isNeg == TRUE && nVal != 0 ){
			nVal = -nVal;
		}
		*(sxi64 *)pOutVal = nVal;
	}
	return zSrc >= zEnd ? SXRET_OK : SXERR_SYNTAX;
}